

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildAsmReg1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstReg)

{
  code *pcVar1;
  bool bVar2;
  RegSlot dstRegSlot;
  undefined4 *puVar3;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  IntConstOpnd *src2Opnd;
  RegOpnd *src1Opnd_00;
  Instr *instr;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0x109) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x77f,"(newOpcode == Js::OpCodeAsmJs::MemorySize_Int)",
                       "newOpcode == Js::OpCodeAsmJs::MemorySize_Int");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  dstRegSlot = GetRegSlotFromTypedReg(this,dstReg,INT32);
  dstOpnd = BuildDstOpnd(this,dstRegSlot,TyInt32);
  src1Opnd = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  src2Opnd = IR::IntConstOpnd::New(0x10,TyUint8,this->m_func,false);
  bVar2 = AsmJsJITInfo::UsesHeapBuffer(this->m_asmFuncInfo);
  if (bVar2) {
    src1Opnd_00 = BuildSrcOpnd(this,5,TyUint32);
    instr = IR::Instr::New(ShrU_I4,&dstOpnd->super_Opnd,&src1Opnd_00->super_Opnd,
                           &src2Opnd->super_Opnd,this->m_func);
  }
  else {
    instr = IR::Instr::New(Ld_I4,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  }
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmReg1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstReg)
{
    Assert(newOpcode == Js::OpCodeAsmJs::MemorySize_Int);
    Js::RegSlot dstRegSlot = GetRegSlotFromIntReg(dstReg);
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    IR::IntConstOpnd* constZero = IR::IntConstOpnd::New(0, TyInt32, m_func);
    IR::IntConstOpnd* constSixteen = IR::IntConstOpnd::New(16, TyUint8, m_func);

    IR::Instr * instr = m_asmFuncInfo->UsesHeapBuffer() ?
        IR::Instr::New(Js::OpCode::ShrU_I4, dstOpnd, BuildSrcOpnd(AsmJsRegSlots::LengthReg, TyUint32), constSixteen, m_func) :
        IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, constZero, m_func);

    AddInstr(instr, offset);

}